

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_e0046::generateRandomFile
               (string *filename,int channelCount,Compression compression,bool bulkWrite,
               Box2i *dataWindow,Box2i *displayWindow)

{
  bool bVar1;
  PixelType PVar2;
  PixelType PVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int i_1;
  uint uVar14;
  int k;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int k_1;
  int i;
  int j_2;
  int iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int j;
  int iVar23;
  ulong uVar24;
  float fVar25;
  Array<Imf_3_2::Array2D<void_*>_> data;
  long local_2a0;
  DeepScanLineOutputFile file;
  int type;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1e0 [376];
  Channel local_68 [56];
  
  std::operator<<((ostream *)&std::cout,"generating ");
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header
            ((Header *)&ss,(Box *)displayWindow,(Box *)dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,
             INCREASING_Y,compression);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_2::Header::~Header((Header *)&ss);
  poVar5 = std::operator<<((ostream *)&std::cout,"compression ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,compression);
  std::operator<<(poVar5," ");
  std::ostream::flush();
  lVar11 = (long)(dataWindow->max).x - (long)(dataWindow->min).x;
  lVar20 = lVar11 + 1;
  lVar12 = (long)(dataWindow->max).y - (long)(dataWindow->min).y;
  lVar22 = lVar12 + 1;
  if (DAT_001d7308 != (anonymous_namespace)::channelTypes) {
    DAT_001d7308 = (anonymous_namespace)::channelTypes;
  }
  uVar15 = 0;
  uVar14 = 0;
  if (0 < channelCount) {
    uVar14 = channelCount;
  }
  for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
    type = random_int(3);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1e0,uVar15);
    std::__cxx11::stringbuf::str();
    if (type == 0) {
      psVar6 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_68,UINT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar6,(Channel *)&frameBuffer);
    }
    if (type == 1) {
      psVar6 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_68,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(psVar6,(Channel *)&frameBuffer);
    }
    if (type == 2) {
      psVar6 = (string *)Imf_3_2::Header::channels();
      Imf_3_2::Channel::Channel(local_68,FLOAT,1,1,false);
      Imf_3_2::ChannelList::insert(psVar6,(Channel *)&frameBuffer);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::channelTypes,&type);
    std::__cxx11::string::~string((string *)&frameBuffer);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,(ulong)(uint)channelCount);
  uVar7 = (ulong)uVar14;
  for (lVar19 = 0; uVar7 * 0x18 - lVar19 != 0; lVar19 = lVar19 + 0x18) {
    Imf_3_2::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)((long)&(data._data)->_sizeX + lVar19),lVar22,lVar20);
  }
  Imf_3_2::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,lVar22,lVar20);
  remove((filename->_M_dataplus)._M_p);
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  Imf_3_2::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  iVar9 = (int)lVar20;
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((anonymous_namespace)::sampleCount._16_8_ + (long)(dataWindow->min).x * -4 +
                     (long)(dataWindow->min).y * (long)iVar9 * -4),4,lVar20 * 4,1,1,0.0,false,false)
  ;
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  lVar20 = 0x10;
  for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
    PVar2 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar16 * 4);
    PVar3 = (uint)(PVar2 != UINT) * 3;
    if (PVar2 == HALF) {
      PVar3 = PVar2;
    }
    if (PVar2 == FLOAT) {
      PVar3 = PVar2;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1e0,(int)uVar16);
    std::__cxx11::stringbuf::str();
    iVar18 = *(int *)((anonymous_namespace)::channelTypes + uVar16 * 4);
    uVar24 = (ulong)(iVar18 == 0) << 2;
    if (iVar18 == 1) {
      uVar24 = 2;
    }
    if (iVar18 == 2) {
      uVar24 = 4;
    }
    Imf_3_2::DeepSlice::DeepSlice
              ((DeepSlice *)local_68,PVar3,
               (char *)(*(long *)((long)&(data._data)->_sizeX + lVar20) +
                        (long)(dataWindow->min).x * -8 +
                       (long)(dataWindow->min).y * (long)iVar9 * -8),8,(long)(iVar9 * 8),uVar24,1,1,
               0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    lVar20 = lVar20 + 0x18;
  }
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  iVar18 = (int)lVar11;
  iVar23 = (int)lVar12;
  std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::flush();
  bVar1 = 999 < iVar18 || 999 < iVar23;
  if (bulkWrite) {
    std::operator<<((ostream *)&std::cout,"bulk ");
    std::ostream::flush();
    for (uVar16 = 0; (long)uVar16 <= (long)iVar23; uVar16 = uVar16 + 1) {
      for (uVar24 = 0; (long)uVar24 <= (long)iVar18; uVar24 = uVar24 + 1) {
        iVar4 = random_int(10);
        lVar20 = (anonymous_namespace)::sampleCount._8_8_;
        if ((bVar1) &&
           ((int)((uVar24 & 0xffffffff) % 0x3f) != 0 || (int)((uVar16 & 0xffffffff) % 0x3f) != 0)) {
          iVar4 = 0;
        }
        *(int *)((anonymous_namespace)::sampleCount._8_8_ * uVar16 * 4 +
                 (anonymous_namespace)::sampleCount._16_8_ + uVar24 * 4) = iVar4;
        iVar13 = ((int)uVar16 * iVar9 + (int)uVar24) % 0x801;
        fVar25 = (float)iVar13;
        lVar22 = lVar20;
        for (uVar17 = 0; uVar17 != uVar7; uVar17 = uVar17 + 1) {
          if (iVar4 < 1) {
            data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24] = (void *)0x0;
          }
          else {
            iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
            if (iVar10 == 0) {
              pvVar8 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ +
                                                       lVar20 * uVar16 * 4 + uVar24 * 4) << 2);
              data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24] = pvVar8;
              iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
            }
            if (iVar10 == 1) {
              pvVar8 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ +
                                                       lVar20 * uVar16 * 4 + uVar24 * 4) * 2);
              data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24] = pvVar8;
              iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
            }
            if (iVar10 == 2) {
              pvVar8 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ +
                                                       lVar20 * uVar16 * 4 + uVar24 * 4) << 2);
              data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24] = pvVar8;
            }
            lVar12 = 0;
            lVar11 = (anonymous_namespace)::sampleCount._16_8_;
            lVar20 = lVar22;
            for (uVar21 = 0; lVar19 = (anonymous_namespace)::channelTypes, lVar22 = lVar20,
                uVar21 < *(uint *)(lVar11 + lVar20 * uVar16 * 4 + uVar24 * 4); uVar21 = uVar21 + 1)
            {
              iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
              if (iVar10 == 0) {
                *(int *)((long)data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24]
                        + lVar12 * 2) = iVar13;
                iVar10 = *(int *)(lVar19 + uVar17 * 4);
              }
              if (iVar10 == 1) {
                Imath_3_2::half::operator=
                          ((half *)((long)data._data[uVar17]._data
                                          [data._data[uVar17]._sizeY * uVar16 + uVar24] + lVar12),
                           fVar25);
                iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
                lVar11 = (anonymous_namespace)::sampleCount._16_8_;
                lVar20 = (anonymous_namespace)::sampleCount._8_8_;
              }
              if (iVar10 == 2) {
                *(float *)((long)data._data[uVar17]._data
                                 [data._data[uVar17]._sizeY * uVar16 + uVar24] + lVar12 * 2) =
                     fVar25;
              }
              lVar12 = lVar12 + 2;
            }
          }
        }
      }
    }
    Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
  }
  else {
    std::operator<<((ostream *)&std::cout,"per-line ");
    std::ostream::flush();
    for (uVar16 = 0; (long)uVar16 <= (long)iVar23; uVar16 = uVar16 + 1) {
      for (uVar24 = 0; (long)uVar24 <= (long)iVar18; uVar24 = uVar24 + 1) {
        iVar4 = random_int(10);
        lVar20 = (anonymous_namespace)::sampleCount._8_8_;
        if ((bVar1) &&
           ((int)((uVar24 & 0xffffffff) % 0x3f) != 0 || (int)((uVar16 & 0xffffffff) % 0x3f) != 0)) {
          iVar4 = 0;
        }
        *(int *)((anonymous_namespace)::sampleCount._8_8_ * uVar16 * 4 +
                 (anonymous_namespace)::sampleCount._16_8_ + uVar24 * 4) = iVar4;
        iVar13 = ((int)uVar16 * iVar9 + (int)uVar24) % 0x801;
        fVar25 = (float)iVar13;
        lVar22 = lVar20;
        for (uVar17 = 0; uVar17 != uVar7; uVar17 = uVar17 + 1) {
          if (iVar4 < 1) {
            data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24] = (void *)0x0;
          }
          else {
            iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
            if (iVar10 == 0) {
              pvVar8 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ +
                                                       lVar20 * uVar16 * 4 + uVar24 * 4) << 2);
              data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24] = pvVar8;
              iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
            }
            if (iVar10 == 1) {
              pvVar8 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ +
                                                       lVar20 * uVar16 * 4 + uVar24 * 4) * 2);
              data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24] = pvVar8;
              iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
            }
            if (iVar10 == 2) {
              pvVar8 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ +
                                                       lVar20 * uVar16 * 4 + uVar24 * 4) << 2);
              data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24] = pvVar8;
            }
            lVar12 = 0;
            lVar11 = (anonymous_namespace)::sampleCount._16_8_;
            lVar20 = lVar22;
            for (uVar21 = 0; lVar19 = (anonymous_namespace)::channelTypes, lVar22 = lVar20,
                uVar21 < *(uint *)(lVar11 + lVar20 * uVar16 * 4 + uVar24 * 4); uVar21 = uVar21 + 1)
            {
              iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
              if (iVar10 == 0) {
                *(int *)((long)data._data[uVar17]._data[data._data[uVar17]._sizeY * uVar16 + uVar24]
                        + lVar12 * 2) = iVar13;
                iVar10 = *(int *)(lVar19 + uVar17 * 4);
              }
              if (iVar10 == 1) {
                Imath_3_2::half::operator=
                          ((half *)((long)data._data[uVar17]._data
                                          [data._data[uVar17]._sizeY * uVar16 + uVar24] + lVar12),
                           fVar25);
                iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar17 * 4);
                lVar11 = (anonymous_namespace)::sampleCount._16_8_;
                lVar20 = (anonymous_namespace)::sampleCount._8_8_;
              }
              if (iVar10 == 2) {
                *(float *)((long)data._data[uVar17]._data
                                 [data._data[uVar17]._sizeY * uVar16 + uVar24] + lVar12 * 2) =
                     fVar25;
              }
              lVar12 = lVar12 + 2;
            }
          }
        }
      }
      Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
    }
  }
  local_2a0 = (long)iVar23;
  lVar20 = 0;
  do {
    if (local_2a0 < lVar20) {
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
      Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
      return;
    }
    for (lVar22 = 0; lVar22 <= iVar18; lVar22 = lVar22 + 1) {
      lVar11 = 4;
      for (uVar16 = 0; uVar7 != uVar16; uVar16 = uVar16 + 1) {
        iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar16 * 4);
        if (iVar9 == 0) {
          pvVar8 = *(void **)(*(long *)((long)data._data + lVar11 * 4 + -8) * lVar20 * 8 +
                              *(long *)((long)&(data._data)->_sizeX + lVar11 * 4) + lVar22 * 8);
          if (pvVar8 != (void *)0x0) {
            operator_delete__(pvVar8);
            iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar16 * 4);
            goto LAB_001469e6;
          }
        }
        else {
LAB_001469e6:
          if (iVar9 == 1) {
            pvVar8 = *(void **)(*(long *)((long)data._data + lVar11 * 4 + -8) * lVar20 * 8 +
                                *(long *)((long)&(data._data)->_sizeX + lVar11 * 4) + lVar22 * 8);
            if (pvVar8 == (void *)0x0) goto LAB_00146a43;
            operator_delete__(pvVar8);
            iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar16 * 4);
          }
          if ((iVar9 == 2) &&
             (pvVar8 = *(void **)(*(long *)((long)data._data + lVar11 * 4 + -8) * lVar20 * 8 +
                                  *(long *)((long)&(data._data)->_sizeX + lVar11 * 4) + lVar22 * 8),
             pvVar8 != (void *)0x0)) {
            operator_delete__(pvVar8);
          }
        }
LAB_00146a43:
        lVar11 = lVar11 + 6;
      }
    }
    lVar20 = lVar20 + 1;
  } while( true );
}

Assistant:

void
generateRandomFile (
    const std::string filename,
    int               channelCount,
    Compression       compression,
    bool              bulkWrite,
    const Box2i&      dataWindow,
    const Box2i&      displayWindow)
{
    cout << "generating " << flush;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    cout << "compression " << compression << " " << flush;

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int          type = random_int (3);
        stringstream ss;
        ss << i;
        string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPSCANLINE);

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    sampleCount.resizeErase (height, width);

    remove (filename.c_str ());
    DeepScanLineOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&sampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str, // name // 6
            DeepSlice (
                type, // type // 7
                (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8
                pointerSize * 1,     // xStride// 9
                pointerSize * width, // yStride// 10
                sampleSize));        // sampleStride
    }

    file.setFrameBuffer (frameBuffer);

    int maxSamples = 10;

    bool bigFile = width > 1000 || height > 1000;

    cout << "writing " << flush;
    if (bulkWrite)
    {
        cout << "bulk " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                int samples = random_int (maxSamples);

                // big files write very sparse data for efficiency: most pixels have no samples

                if (bigFile && (i % 63 != 0 || j % 63 != 0)) { samples = 0; }
                sampleCount[i][j] = samples;

                for (int k = 0; k < channelCount; k++)
                {
                    if (samples > 0)
                    {

                        if (channelTypes[k] == 0)
                            data[k][i][j] = new unsigned int[sampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[sampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[sampleCount[i][j]];
                        for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                        {
                            if (channelTypes[k] == 0)
                                ((unsigned int*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 1)
                                ((half*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 2)
                                ((float*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                        }
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
            }
        }

        file.writePixels (height);
    }
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                int samples = random_int (maxSamples);

                // big files write very sparse data for efficiency: most pixels have no samples
                if (bigFile && (i % 63 != 0 || j % 63 != 0)) { samples = 0; }
                sampleCount[i][j] = samples;

                for (int k = 0; k < channelCount; k++)
                {

                    if (samples > 0)
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] = new unsigned int[sampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[sampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[sampleCount[i][j]];
                        for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                        {
                            if (channelTypes[k] == 0)
                                ((unsigned int*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 1)
                                ((half*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 2)
                                ((float*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                        }
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
            }
            file.writePixels (1);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0) delete[](unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
            }
}